

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_x86_64-inl.h
# Opt level: O1

int google::GetStackTrace(void **result,int max_depth,int skip_count)

{
  trace_arg_t targ;
  void **local_20;
  int local_18;
  int local_14;
  int local_10;
  
  local_10 = 0;
  if (ready_to_run == '\x01') {
    local_14 = skip_count + 1;
    local_10 = 0;
    local_20 = result;
    local_18 = max_depth;
    _Unwind_Backtrace(GetOneFrame,&local_20);
  }
  return local_10;
}

Assistant:

int GetStackTrace(void** result, int max_depth, int skip_count) {
  if (!ready_to_run)
    return 0;

  trace_arg_t targ;

  skip_count += 1;         // Do not include the "GetStackTrace" frame

  targ.result = result;
  targ.max_depth = max_depth;
  targ.skip_count = skip_count;
  targ.count = 0;

  _Unwind_Backtrace(GetOneFrame, &targ);

  return targ.count;
}